

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O0

PmError Pm_Enqueue(PmQueue *q,void *msg)

{
  int iVar1;
  int32_t j;
  int rslt;
  int32_t *dest;
  int32_t *ptr;
  int32_t *src;
  long lStack_30;
  int i;
  long tail;
  PmQueueRep *queue;
  void *msg_local;
  PmQueue *q_local;
  
  if (q == (PmQueue *)0x0) {
    q_local._4_4_ = pmBadPtr;
  }
  else if (*(long *)((long)q + 0x18) == 0) {
    iVar1 = Pm_QueueFull(q);
    lStack_30 = *(long *)((long)q + 8);
    if (iVar1 == 0) {
      dest = (int32_t *)(*(long *)((long)q + 0x28) + lStack_30 * 4);
      _j = dest;
      for (src._4_4_ = 1; _j = _j + 1, src._4_4_ < *(int *)((long)q + 0x20);
          src._4_4_ = src._4_4_ + 1) {
        iVar1 = *(int *)((long)msg + (long)(src._4_4_ + -1) * 4);
        if (iVar1 == 0) {
          *dest = src._4_4_;
          dest = _j;
        }
        else {
          *_j = iVar1;
        }
      }
      *dest = src._4_4_;
      lStack_30 = *(int *)((long)q + 0x20) + lStack_30;
      if (lStack_30 == *(long *)((long)q + 0x10)) {
        lStack_30 = 0;
      }
      *(long *)((long)q + 8) = lStack_30;
      q_local._4_4_ = pmNoData;
    }
    else {
      *(long *)((long)q + 0x18) = lStack_30 + 1;
      q_local._4_4_ = pmBufferOverflow;
    }
  }
  else {
    q_local._4_4_ = pmBufferOverflow;
  }
  return q_local._4_4_;
}

Assistant:

PMEXPORT PmError Pm_Enqueue(PmQueue *q, void *msg)
{
    PmQueueRep *queue = (PmQueueRep *) q;
    long tail;
    int i;
    int32_t *src = (int32_t *) msg;
    int32_t *ptr;
    int32_t *dest;
    int rslt;
    if (!queue) 
        return pmBadPtr;
    /* no more enqueue until receiver acknowledges overflow */
    if (queue->overflow) return pmBufferOverflow;
    rslt = Pm_QueueFull(q);
    /* already checked above: if (rslt == pmBadPtr) return rslt; */
    tail = queue->tail;
    if (rslt) {
        queue->overflow = tail + 1;
        return pmBufferOverflow;
    }

    /* queue is has room for message, and overflow flag is cleared */
    ptr = &queue->buffer[tail];
    dest = ptr + 1;
    for (i = 1; i < queue->msg_size; i++) {
        int32_t j = src[i - 1];
        if (!j) {
            *ptr = i;
            ptr = dest;
        } else {
            *dest = j;
        }
        dest++;
    }
    *ptr = i;
    tail += queue->msg_size;
    if (tail == queue->len) tail = 0;
    queue->tail = tail;
    return pmNoError;
}